

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsCouple.h
# Opt level: O3

bool __thiscall
chrono::ChShaftsCouple::Initialize
          (ChShaftsCouple *this,shared_ptr<chrono::ChShaft> *mshaft1,
          shared_ptr<chrono::ChShaft> *mshaft2)

{
  element_type *peVar1;
  element_type *peVar2;
  
  peVar1 = (mshaft1->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     (peVar2 = (mshaft2->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
     peVar2 == (element_type *)0x0)) {
    __assert_fail("mm1 && mm2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChShaftsCouple.h"
                  ,0x33,
                  "virtual bool chrono::ChShaftsCouple::Initialize(std::shared_ptr<ChShaft>, std::shared_ptr<ChShaft>)"
                 );
  }
  if (peVar1 == peVar2) {
    __assert_fail("mm1 != mm2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChShaftsCouple.h"
                  ,0x34,
                  "virtual bool chrono::ChShaftsCouple::Initialize(std::shared_ptr<ChShaft>, std::shared_ptr<ChShaft>)"
                 );
  }
  if ((peVar1->super_ChPhysicsItem).system == (peVar2->super_ChPhysicsItem).system) {
    this->shaft1 = peVar1;
    this->shaft2 = peVar2;
    (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[6])();
    return true;
  }
  __assert_fail("mm1->GetSystem() == mm2->GetSystem()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChShaftsCouple.h"
                ,0x35,
                "virtual bool chrono::ChShaftsCouple::Initialize(std::shared_ptr<ChShaft>, std::shared_ptr<ChShaft>)"
               );
}

Assistant:

virtual bool Initialize(std::shared_ptr<ChShaft> mshaft1,  ///< first  shaft to join
                            std::shared_ptr<ChShaft>
                                mshaft2  ///< second shaft to join
                            ) {
        ChShaft* mm1 = mshaft1.get();
        ChShaft* mm2 = mshaft2.get();
        assert(mm1 && mm2);
        assert(mm1 != mm2);
        assert(mm1->GetSystem() == mm2->GetSystem());
        shaft1 = mm1;
        shaft2 = mm2;
        SetSystem(shaft1->GetSystem());
        return true;
    }